

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::CheckOpcode1
          (TypeChecker *this,Opcode opcode,Limits *limits,bool has_address_operands)

{
  Type TVar1;
  Address AVar2;
  char *desc;
  bool local_35;
  Type local_30;
  bool has_address_operands_local;
  Limits *limits_local;
  TypeChecker *this_local;
  Opcode opcode_local;
  Result result;
  
  this_local._0_4_ = opcode.enum_;
  TVar1 = Opcode::GetParamType1((Opcode *)&this_local);
  local_35 = true;
  if (!has_address_operands) {
    AVar2 = Opcode::GetMemorySize((Opcode *)&this_local);
    local_35 = AVar2 != 0;
  }
  TVar1 = Opcode::GetMemoryParam((Opcode *)&this_local,TVar1,limits,local_35);
  desc = Opcode::GetName((Opcode *)&this_local);
  this_local._4_4_ = PopAndCheck1Type(this,TVar1,desc);
  if (has_address_operands) {
    TVar1 = Opcode::GetResultType((Opcode *)&this_local);
    local_30 = Opcode::GetMemoryParam((Opcode *)&this_local,TVar1,limits,true);
  }
  else {
    local_30 = Opcode::GetResultType((Opcode *)&this_local);
  }
  PushType(this,local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::CheckOpcode1(Opcode opcode,
                                 const Limits* limits,
                                 bool has_address_operands) {
  Result result =
      PopAndCheck1Type(opcode.GetMemoryParam(
                           opcode.GetParamType1(), limits,
                           has_address_operands || opcode.GetMemorySize() != 0),
                       opcode.GetName());
  PushType(has_address_operands
               ? opcode.GetMemoryParam(opcode.GetResultType(), limits, true)
               : opcode.GetResultType());
  return result;
}